

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O2

uint64_t farmhashna::Hash64(char *s,size_t len)

{
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  char *s_00;
  ulong uVar12;
  long lVar13;
  pair<unsigned_long,_unsigned_long> pVar14;
  pair<unsigned_long,_unsigned_long> pVar15;
  
  if (0x20 < len) {
    if (len < 0x41) {
      lVar1 = len * 2 + -0x651e95c4d06fbfb1;
      lVar4 = *(long *)s * -0x651e95c4d06fbfb1;
      uVar8 = *(long *)(s + (len - 8)) * lVar1;
      uVar9 = lVar4 + *(long *)(s + 8);
      uVar10 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
      uVar5 = lVar4 + *(long *)(s + 0x18);
      uVar12 = (uVar8 >> 0x1e | uVar8 << 0x22) + (uVar9 >> 0x2b | uVar9 * 0x200000) +
               *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
      uVar8 = (uVar10 >> 0x12 | uVar10 << 0x2e) + lVar4 + uVar8;
      uVar9 = (uVar12 ^ uVar8) * lVar1;
      uVar10 = (uVar12 + *(long *)(s + (len - 0x20))) * lVar1;
      uVar8 = (uVar9 >> 0x2f ^ uVar8 ^ uVar9) * lVar1;
      uVar9 = *(long *)(s + 0x10) * lVar1 + *(long *)(s + 0x18);
      uVar5 = (uVar5 >> 0x12 | uVar5 << 0x2e) + *(long *)(s + 0x10) * lVar1 + uVar10;
      uVar9 = ((uVar10 >> 0x1e | uVar10 << 0x22) + (uVar9 >> 0x2b | uVar9 * 0x200000) +
               ((uVar8 >> 0x2f ^ uVar8) * lVar1 + *(long *)(s + (len - 0x18))) * lVar1 ^ uVar5) *
              lVar1;
      uVar9 = (uVar9 >> 0x2f ^ uVar5 ^ uVar9) * lVar1;
      uVar3 = (uVar9 >> 0x2f ^ uVar9) * lVar1;
    }
    else {
      uVar5 = len - 1 & 0xffffffffffffffc0;
      uVar9 = (ulong)((uint)(len - 1) & 0x3f);
      lVar1 = (uVar9 - 0x3f) + uVar5;
      if (s + (len - 0x40) != s + lVar1) {
        __assert_fail("s + len - 64 == last64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/farmhash.cc"
                      ,0x226,"uint64_t farmhashna::Hash64(const char *, size_t)");
      }
      lVar13 = *(long *)s + 0x1529cba0ca458ff;
      lVar4 = uVar9 + uVar5;
      s_00 = s + 0x20;
      lVar11 = 0x226bb95b4e64b6d4;
      uVar8 = 0x134a747f856d0526;
      pVar15 = (pair<unsigned_long,_unsigned_long>)ZEXT816(0);
      pVar14 = (pair<unsigned_long,_unsigned_long>)ZEXT816(0);
      do {
        uVar8 = uVar8 + pVar15.first;
        uVar12 = lVar13 + pVar14.first + lVar11 + *(long *)(s_00 + -0x18);
        uVar10 = lVar11 + pVar14.second + *(long *)(s_00 + 0x10);
        lVar13 = (uVar8 >> 0x21 | uVar8 * 0x80000000) * -0x4b6d499041670d8d;
        uVar8 = (uVar12 >> 0x25 | uVar12 * 0x8000000) * -0x4b6d499041670d8d ^ pVar15.second;
        lVar11 = pVar14.first + *(long *)(s_00 + 8) +
                 (uVar10 >> 0x2a | uVar10 * 0x400000) * -0x4b6d499041670d8d;
        pVar14 = WeakHashLen32WithSeeds
                           (s_00 + -0x20,pVar14.second * -0x4b6d499041670d8d,pVar15.first + uVar8);
        pVar15 = WeakHashLen32WithSeeds
                           (s_00,pVar15.second + lVar13,*(long *)(s_00 + -0x10) + lVar11);
        s_00 = s_00 + 0x40;
        uVar5 = uVar5 - 0x40;
      } while (uVar5 != 0);
      lVar6 = pVar15.first + uVar9;
      lVar2 = (uVar8 & 0xff) * 2 + -0x4b6d499041670d8d;
      lVar7 = pVar14.first + lVar6;
      uVar9 = lVar11 + pVar14.second + *(long *)(s + lVar4 + -0xf);
      uVar5 = lVar13 + lVar11 + lVar7 + *(long *)(s + lVar4 + -0x37);
      lVar6 = lVar6 + lVar7;
      uVar8 = uVar8 + lVar6;
      uVar10 = uVar8 >> 0x21 | uVar8 * 0x80000000;
      uVar9 = lVar7 * 9 + *(long *)(s + lVar4 + -0x17) + (uVar9 >> 0x2a | uVar9 * 0x400000) * lVar2;
      uVar8 = pVar15.second * 9 ^ (uVar5 >> 0x25 | uVar5 * 0x8000000) * lVar2;
      pVar14 = WeakHashLen32WithSeeds(s + lVar1,pVar14.second * lVar2,lVar6 + uVar8);
      pVar15 = WeakHashLen32WithSeeds
                         (s + lVar4 + -0x1f,uVar10 * lVar2 + pVar15.second,
                          *(long *)(s + lVar4 + -0x2f) + uVar9);
      uVar12 = SUB168((undefined1  [16])pVar14 ^ (undefined1  [16])pVar15,0) * lVar2;
      uVar5 = SUB168((undefined1  [16])pVar14 ^ (undefined1  [16])pVar15,8) * lVar2;
      uVar12 = (uVar12 >> 0x2f ^ pVar15.first ^ uVar12) * lVar2;
      uVar5 = (uVar5 >> 0x2f ^ pVar15.second ^ uVar5) * lVar2;
      uVar9 = ((uVar5 >> 0x2f ^ uVar5) + uVar10) * lVar2;
      uVar9 = ((uVar9 >> 0x2f ^ uVar9) * -0x3c5a37a36834ced9 + uVar8 +
               (uVar12 >> 0x2f ^ uVar12) * lVar2 ^ uVar9) * lVar2;
      uVar9 = (uVar9 >> 0x2f ^ uVar9 ^ uVar9) * lVar2;
      uVar3 = (uVar9 >> 0x2f ^ uVar9) * lVar2;
    }
    return uVar3;
  }
  if (len < 0x11) {
    uVar3 = HashLen0to16(s,len);
    return uVar3;
  }
  uVar3 = HashLen17to32(s,len);
  return uVar3;
}

Assistant:

uint64_t Hash64(const char *s, size_t len) {
  const uint64_t seed = 81;
  if (len <= 32) {
    if (len <= 16) {
      return HashLen0to16(s, len);
    } else {
      return HashLen17to32(s, len);
    }
  } else if (len <= 64) {
    return HashLen33to64(s, len);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 56 bytes: v, w, x, y, and z.
  uint64_t x = seed;
  uint64_t y = seed * k1 + 113;
  uint64_t z = ShiftMix(y * k2 + 113) * k2;
  pair<uint64_t, uint64_t> v = make_pair(0, 0);
  pair<uint64_t, uint64_t> w = make_pair(0, 0);
  x = x * k2 + Fetch(s);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    x = Rotate(x + y + v.first + Fetch(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
    std::swap(z, x);
    s += 64;
  } while (s != end);
  uint64_t mul = k1 + ((z & 0xff) << 1);
  // Make s point to the last 64 bytes of input.
  s = last64;
  w.first += ((len - 1) & 63);
  v.first += w.first;
  w.first += v.first;
  x = Rotate(x + y + v.first + Fetch(s + 8), 37) * mul;
  y = Rotate(y + v.second + Fetch(s + 48), 42) * mul;
  x ^= w.second * 9;
  y += v.first * 9 + Fetch(s + 40);
  z = Rotate(z + w.first, 33) * mul;
  v = WeakHashLen32WithSeeds(s, v.second * mul, x + w.first);
  w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
  std::swap(z, x);
  return HashLen16(HashLen16(v.first, w.first, mul) + ShiftMix(y) * k0 + z,
                   HashLen16(v.second, w.second, mul) + x,
                   mul);
}